

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::updateOrder(Application *this,Order *order,char status)

{
  Side side;
  string *psVar1;
  long lVar2;
  SessionNotFound *anon_var_0;
  string local_778 [32];
  double local_758;
  LastPx local_750;
  double local_6f8;
  LastShares local_6f0;
  double local_698;
  OrderQty local_690;
  ClOrdID local_638;
  double local_5e0;
  AvgPx local_5d8;
  double local_580;
  CumQty local_578;
  double local_520;
  LeavesQty local_518;
  Side local_4c0;
  Symbol local_468;
  OrdStatus local_410;
  ExecType local_3b8;
  ExecTransType local_360;
  string local_308;
  ExecID local_2e8;
  OrderID local_290;
  undefined1 local_238 [8];
  ExecutionReport fixOrder;
  undefined1 local_d0 [8];
  SenderCompID senderCompID;
  TargetCompID targetCompID;
  char status_local;
  Order *order_local;
  Application *this_local;
  
  targetCompID.super_StringField.super_FieldBase.m_metrics.m_checksum._3_1_ = status;
  psVar1 = Order::getOwner_abi_cxx11_(order);
  FIX::TargetCompID::TargetCompID
            ((TargetCompID *)&senderCompID.super_StringField.super_FieldBase.m_metrics,psVar1);
  psVar1 = Order::getTarget_abi_cxx11_(order);
  FIX::SenderCompID::SenderCompID((SenderCompID *)local_d0,psVar1);
  psVar1 = Order::getClientID_abi_cxx11_(order);
  FIX::OrderID::OrderID(&local_290,psVar1);
  IDGenerator::genExecutionID_abi_cxx11_(&local_308,&this->m_generator);
  FIX::ExecID::ExecID(&local_2e8,&local_308);
  FIX::ExecTransType::ExecTransType(&local_360,"0812211Application");
  FIX::ExecType::ExecType
            (&local_3b8,
             (CHAR *)((long)&targetCompID.super_StringField.super_FieldBase.m_metrics.m_checksum + 3
                     ));
  FIX::OrdStatus::OrdStatus
            (&local_410,
             (CHAR *)((long)&targetCompID.super_StringField.super_FieldBase.m_metrics.m_checksum + 3
                     ));
  psVar1 = Order::getSymbol_abi_cxx11_(order);
  FIX::Symbol::Symbol(&local_468,psVar1);
  side = Order::getSide(order);
  convert(&local_4c0,this,side);
  lVar2 = Order::getOpenQuantity(order);
  local_520 = (double)lVar2;
  FIX::LeavesQty::LeavesQty(&local_518,&local_520);
  lVar2 = Order::getExecutedQuantity(order);
  local_580 = (double)lVar2;
  FIX::CumQty::CumQty(&local_578,&local_580);
  local_5e0 = Order::getAvgExecutedPrice(order);
  FIX::AvgPx::AvgPx(&local_5d8,&local_5e0);
  FIX42::ExecutionReport::ExecutionReport
            ((ExecutionReport *)local_238,&local_290,&local_2e8,&local_360,&local_3b8,&local_410,
             &local_468,&local_4c0,&local_518,&local_578,&local_5d8);
  FIX::AvgPx::~AvgPx(&local_5d8);
  FIX::CumQty::~CumQty(&local_578);
  FIX::LeavesQty::~LeavesQty(&local_518);
  FIX::Side::~Side(&local_4c0);
  FIX::Symbol::~Symbol(&local_468);
  FIX::OrdStatus::~OrdStatus(&local_410);
  FIX::ExecType::~ExecType(&local_3b8);
  FIX::ExecTransType::~ExecTransType(&local_360);
  FIX::ExecID::~ExecID(&local_2e8);
  std::__cxx11::string::~string((string *)&local_308);
  FIX::OrderID::~OrderID(&local_290);
  psVar1 = Order::getClientID_abi_cxx11_(order);
  FIX::ClOrdID::ClOrdID(&local_638,psVar1);
  FIX42::ExecutionReport::set((ExecutionReport *)local_238,&local_638);
  FIX::ClOrdID::~ClOrdID(&local_638);
  lVar2 = Order::getQuantity(order);
  local_698 = (double)lVar2;
  FIX::OrderQty::OrderQty(&local_690,&local_698);
  FIX42::ExecutionReport::set((ExecutionReport *)local_238,&local_690);
  FIX::OrderQty::~OrderQty(&local_690);
  if ((targetCompID.super_StringField.super_FieldBase.m_metrics.m_checksum._3_1_ == '2') ||
     (targetCompID.super_StringField.super_FieldBase.m_metrics.m_checksum._3_1_ == '1')) {
    lVar2 = Order::getLastExecutedQuantity(order);
    local_6f8 = (double)lVar2;
    FIX::LastShares::LastShares(&local_6f0,&local_6f8);
    FIX42::ExecutionReport::set((ExecutionReport *)local_238,&local_6f0);
    FIX::LastShares::~LastShares(&local_6f0);
    local_758 = Order::getLastExecutedPrice(order);
    FIX::LastPx::LastPx(&local_750,&local_758);
    FIX42::ExecutionReport::set((ExecutionReport *)local_238,&local_750);
    FIX::LastPx::~LastPx(&local_750);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_778,"",(allocator<char> *)((long)&anon_var_0 + 7));
  FIX::Session::sendToTarget
            ((Message *)local_238,(SenderCompID *)local_d0,
             (TargetCompID *)&senderCompID.super_StringField.super_FieldBase.m_metrics,local_778);
  std::__cxx11::string::~string(local_778);
  std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
  FIX42::ExecutionReport::~ExecutionReport((ExecutionReport *)local_238);
  FIX::SenderCompID::~SenderCompID((SenderCompID *)local_d0);
  FIX::TargetCompID::~TargetCompID
            ((TargetCompID *)&senderCompID.super_StringField.super_FieldBase.m_metrics);
  return;
}

Assistant:

void Application::updateOrder(const Order &order, char status) {
  FIX::TargetCompID targetCompID(order.getOwner());
  FIX::SenderCompID senderCompID(order.getTarget());

  FIX42::ExecutionReport fixOrder(
      FIX::OrderID(order.getClientID()),
      FIX::ExecID(m_generator.genExecutionID()),
      FIX::ExecTransType(FIX::ExecTransType_NEW),
      FIX::ExecType(status),
      FIX::OrdStatus(status),
      FIX::Symbol(order.getSymbol()),
      FIX::Side(convert(order.getSide())),
      FIX::LeavesQty(order.getOpenQuantity()),
      FIX::CumQty(order.getExecutedQuantity()),
      FIX::AvgPx(order.getAvgExecutedPrice()));

  fixOrder.set(FIX::ClOrdID(order.getClientID()));
  fixOrder.set(FIX::OrderQty(order.getQuantity()));

  if (status == FIX::OrdStatus_FILLED || status == FIX::OrdStatus_PARTIALLY_FILLED) {
    fixOrder.set(FIX::LastShares(order.getLastExecutedQuantity()));
    fixOrder.set(FIX::LastPx(order.getLastExecutedPrice()));
  }

  try {
    FIX::Session::sendToTarget(fixOrder, senderCompID, targetCompID);
  } catch (FIX::SessionNotFound &) {}
}